

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

mp_int * mp_from_bytes_int(ptrlen bytes,size_t m,size_t c)

{
  ulong *puVar1;
  mp_int *pmVar2;
  byte bVar3;
  ulong uVar4;
  byte *pbVar5;
  
  uVar4 = bytes.len + 7 >> 3;
  pmVar2 = mp_make_sized(uVar4 + (uVar4 == 0));
  pbVar5 = (byte *)((long)bytes.ptr + c);
  bVar3 = 0;
  for (uVar4 = 0; bytes.len != uVar4; uVar4 = uVar4 + 1) {
    puVar1 = (ulong *)((long)pmVar2->w + (uVar4 & 0xfffffffffffffff8));
    *puVar1 = *puVar1 | (ulong)*pbVar5 << (bVar3 & 0x38);
    bVar3 = bVar3 + 8;
    pbVar5 = pbVar5 + m;
  }
  return pmVar2;
}

Assistant:

static mp_int *mp_from_bytes_int(ptrlen bytes, size_t m, size_t c)
{
    size_t nw = (bytes.len + BIGNUM_INT_BYTES - 1) / BIGNUM_INT_BYTES;
    nw = size_t_max(nw, 1);
    mp_int *n = mp_make_sized(nw);
    for (size_t i = 0; i < bytes.len; i++)
        n->w[i / BIGNUM_INT_BYTES] |=
            (BignumInt)(((const unsigned char *)bytes.ptr)[m*i+c]) <<
            (8 * (i % BIGNUM_INT_BYTES));
    return n;
}